

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_get.c
# Opt level: O1

int mpt_message_get(mpt_queue *qu,size_t off,size_t take,mpt_message *msg,iovec *vec)

{
  int iVar1;
  ulong in_RAX;
  void *pvVar2;
  int *piVar3;
  ulong uVar4;
  ulong uVar5;
  ulong local_38;
  
  local_38 = in_RAX;
  pvVar2 = mpt_queue_data(qu,&local_38);
  uVar4 = qu->len - local_38;
  uVar5 = local_38 - off;
  if (local_38 < off || uVar5 == 0) {
    local_38 = off - local_38;
    uVar5 = uVar4 - local_38;
    if (uVar4 < local_38) {
      piVar3 = __errno_location();
      *piVar3 = 0x16;
      return -1;
    }
    pvVar2 = (void *)(local_38 + (long)qu->base);
    uVar4 = 0;
  }
  else {
    pvVar2 = (void *)((long)pvVar2 + off);
  }
  local_38 = uVar5;
  if (uVar4 + uVar5 < take) {
    piVar3 = __errno_location();
    *piVar3 = 0x22;
    iVar1 = -2;
  }
  else if (take < uVar5 || take - uVar5 == 0) {
    msg->base = pvVar2;
    msg->used = take;
    msg->clen = 0;
    iVar1 = 0;
  }
  else if (vec == (iovec *)0x0) {
    piVar3 = __errno_location();
    *piVar3 = 0x16;
    iVar1 = -3;
  }
  else {
    msg->base = pvVar2;
    msg->used = uVar5;
    msg->clen = 1;
    msg->cont = vec;
    vec->iov_base = qu->base;
    vec->iov_len = take - uVar5;
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

extern int mpt_message_get(const MPT_STRUCT(queue) *qu, size_t off, size_t take, MPT_STRUCT(message) *msg, struct iovec *vec)
{
	uint8_t *base;
	size_t low, high, len;
	
	base = mpt_queue_data(qu, &low);
	high = qu->len - low;
	
	if (off < low) {
		base += off;
		low  -= off;
	}
	else {
		len = off - low;
		base = ((uint8_t *) qu->base) + len;
		if (len > high) {
			errno = EINVAL;
			return -1;
		}
		low  = high - len;
		high = 0;
	}
	if (take > (len = low + high)) {
		errno = ERANGE;
		return -2;
	}
	if (take <= low) {
		msg->base = base;
		msg->used = take;
		msg->clen = 0;
		return 0;
	}
	else if (!vec) {
		errno = EINVAL;
		return -3;
	}
	else {
		msg->base = base;
		msg->used = low;
		msg->clen = 1;
		msg->cont = vec;
		vec->iov_base = qu->base;
		vec->iov_len  = take - low;
		return 1;
	}
}